

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeSorterReset(sqlite3 *db,VdbeSorter *pSorter)

{
  byte bVar1;
  UnpackedRecord *p;
  u8 *p_00;
  sqlite3_file *psVar2;
  SorterRecord *pSVar3;
  SorterRecord *pSVar4;
  long lVar5;
  ulong uVar6;
  SortSubtask *pSVar7;
  
  bVar1 = pSorter->nTask;
  if ((ulong)bVar1 != 0) {
    lVar5 = (ulong)bVar1 + 1;
    pSVar7 = (SortSubtask *)
             ((long)&((VdbeSorter *)(pSorter->aTask + -1))->mnPmaSize + (ulong)((uint)bVar1 * 0x60))
    ;
    do {
      vdbeSorterJoinThread(pSVar7);
      lVar5 = lVar5 + -1;
      pSVar7 = pSVar7 + -1;
    } while (1 < lVar5);
  }
  if (pSorter->pReader != (PmaReader *)0x0) {
    vdbePmaReaderClear(pSorter->pReader);
    if (pSorter->pReader != (PmaReader *)0x0) {
      sqlite3DbFreeNN(db,pSorter->pReader);
    }
    pSorter->pReader = (PmaReader *)0x0;
  }
  vdbeMergeEngineFree(pSorter->pMerger);
  pSorter->pMerger = (MergeEngine *)0x0;
  if (pSorter->nTask != '\0') {
    uVar6 = 0;
    do {
      p = pSorter->aTask[uVar6].pUnpacked;
      if (p != (UnpackedRecord *)0x0) {
        sqlite3DbFreeNN(db,p);
      }
      pSVar7 = pSorter->aTask + uVar6;
      p_00 = (pSVar7->list).aMemory;
      if (p_00 == (u8 *)0x0) {
        pSVar4 = (pSVar7->list).pList;
        while (pSVar4 != (SorterRecord *)0x0) {
          pSVar3 = (pSVar4->u).pNext;
          sqlite3_free(pSVar4);
          pSVar4 = pSVar3;
        }
      }
      else {
        sqlite3_free(p_00);
      }
      psVar2 = (pSVar7->file).pFd;
      if (psVar2 != (sqlite3_file *)0x0) {
        if (psVar2->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar2->pMethods->xClose)(psVar2);
          psVar2->pMethods = (sqlite3_io_methods *)0x0;
        }
        sqlite3_free(psVar2);
      }
      psVar2 = (pSVar7->file2).pFd;
      if (psVar2 != (sqlite3_file *)0x0) {
        if (psVar2->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar2->pMethods->xClose)(psVar2);
          psVar2->pMethods = (sqlite3_io_methods *)0x0;
        }
        sqlite3_free(psVar2);
      }
      pSVar7->pSorter = (VdbeSorter *)0x0;
      pSVar7->pUnpacked = (UnpackedRecord *)0x0;
      (pSVar7->file2).pFd = (sqlite3_file *)0x0;
      (pSVar7->file2).iEof = 0;
      (pSVar7->file).pFd = (sqlite3_file *)0x0;
      (pSVar7->file).iEof = 0;
      (pSVar7->list).szPMA = 0;
      pSVar7->xCompare = (SorterCompare)0x0;
      (pSVar7->list).pList = (SorterRecord *)0x0;
      (pSVar7->list).aMemory = (u8 *)0x0;
      pSVar7->pThread = (SQLiteThread *)0x0;
      pSVar7->bDone = 0;
      pSVar7->nPMA = 0;
      pSVar7->pSorter = pSorter;
      uVar6 = uVar6 + 1;
    } while (uVar6 < pSorter->nTask);
  }
  if ((pSorter->list).aMemory == (u8 *)0x0) {
    pSVar4 = (pSorter->list).pList;
    while (pSVar4 != (SorterRecord *)0x0) {
      pSVar3 = (pSVar4->u).pNext;
      sqlite3_free(pSVar4);
      pSVar4 = pSVar3;
    }
  }
  (pSorter->list).pList = (SorterRecord *)0x0;
  (pSorter->list).szPMA = 0;
  pSorter->bUsePMA = '\0';
  pSorter->iMemory = 0;
  pSorter->mxKeysize = 0;
  if (pSorter->pUnpacked != (UnpackedRecord *)0x0) {
    sqlite3DbFreeNN(db,pSorter->pUnpacked);
  }
  pSorter->pUnpacked = (UnpackedRecord *)0x0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeSorterReset(sqlite3 *db, VdbeSorter *pSorter){
  int i;
  (void)vdbeSorterJoinAll(pSorter, SQLITE_OK);
  assert( pSorter->bUseThreads || pSorter->pReader==0 );
#if SQLITE_MAX_WORKER_THREADS>0
  if( pSorter->pReader ){
    vdbePmaReaderClear(pSorter->pReader);
    sqlite3DbFree(db, pSorter->pReader);
    pSorter->pReader = 0;
  }
#endif
  vdbeMergeEngineFree(pSorter->pMerger);
  pSorter->pMerger = 0;
  for(i=0; i<pSorter->nTask; i++){
    SortSubtask *pTask = &pSorter->aTask[i];
    vdbeSortSubtaskCleanup(db, pTask);
    pTask->pSorter = pSorter;
  }
  if( pSorter->list.aMemory==0 ){
    vdbeSorterRecordFree(0, pSorter->list.pList);
  }
  pSorter->list.pList = 0;
  pSorter->list.szPMA = 0;
  pSorter->bUsePMA = 0;
  pSorter->iMemory = 0;
  pSorter->mxKeysize = 0;
  sqlite3DbFree(db, pSorter->pUnpacked);
  pSorter->pUnpacked = 0;
}